

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkIdUsed(CheckerVisitor *this,Id *id,Node *p,ValueRef *v)

{
  bool bVar1;
  SymbolInfo *pSVar2;
  char cVar3;
  BinExpr *bin;
  TreeOp TVar4;
  
  if (p == (Node *)0x0) {
LAB_00143a9c:
    bVar1 = v->assigned;
    pSVar2 = v->info;
    pSVar2->used = true;
    if (bVar1 != true) goto LAB_00143ab8;
LAB_00143ab0:
    pSVar2->usedAfterAssign = true;
LAB_00143ab4:
    bVar1 = false;
  }
  else {
    TVar4 = p->_op;
    if (TVar4 == TO_EXPR_STMT) {
      p = (Node *)p[1].super_ArenaObj._vptr_ArenaObj;
      cVar3 = v->assigned;
      if (p == (Node *)0x0) {
        pSVar2 = v->info;
        pSVar2->used = true;
        if ((bool)cVar3 == false) goto LAB_00143ab8;
        goto LAB_00143ab0;
      }
      TVar4 = p->_op;
    }
    else {
      if (0x34 < TVar4 - TO_ID) goto LAB_00143a9c;
      cVar3 = v->assigned;
    }
    if (((TVar4 < TO_NOT) && ((0x1f00000100000U >> ((ulong)TVar4 & 0x3f) & 1) != 0)) &&
       ((Id *)p[1].super_ArenaObj._vptr_ArenaObj == id)) {
      pSVar2 = v->info;
      bVar1 = true;
      if (pSVar2->usedAfterAssign == false) {
        bVar1 = existsInTree(this,&id->super_Expr,*(Expr **)&p[1]._coordinates);
        pSVar2 = v->info;
      }
      pSVar2->used = (bool)(pSVar2->used | bVar1);
      v->assigned = true;
      v->lastAssigneeScope = this->currentScope;
      pSVar2->usedAfterAssign = false;
      if (TVar4 == TO_ASSIGN) {
        return;
      }
    }
    pSVar2 = v->info;
    pSVar2->used = true;
    if (cVar3 == '\0') goto LAB_00143ab8;
    pSVar2->usedAfterAssign = true;
    if ((int)p->_op < 0x2c) goto LAB_00143ab4;
    bVar1 = p->_op < TO_NOT;
  }
  v->assigned = bVar1;
LAB_00143ab8:
  if (v->state == VRS_UNDEFINED) {
    report(this,(Node *)id,0x86);
    return;
  }
  if (v->state != VRS_PARTIALLY) {
    return;
  }
  report(this,(Node *)id,0x85,id->_id);
  return;
}

Assistant:

void CheckerVisitor::checkIdUsed(const Id *id, const Node *p, ValueRef *v) {
  const Expr *e = nullptr;
  if (p) {
    if (p->op() == TO_EXPR_STMT)
      e = static_cast<const ExprStatement *>(p)->expression();
    else if (p->isExpression())
      e = p->asExpression();
  }

  bool assigned = v->assigned;

  if (e && isAssignExpr(e)) {
    const BinExpr *bin = static_cast<const BinExpr *>(e);
    const Expr *lhs = bin->lhs();
    Expr *rhs = bin->rhs();
    bool simpleAsgn = e->op() == TO_ASSIGN;
    if (id == lhs) {
      bool used = v->info->usedAfterAssign || existsInTree(id, rhs);
      //if (!used && assigned && simpleAsgn) {
      //  if (!v->lastAssigneeScope || currentScope->owner == v->lastAssigneeScope->owner)
      //    report(bin, DiagnosticsId::DI_REASSIGN_WITH_NO_USAGE);
      //}
      v->info->used |= used;
      v->assigned = true;
      v->lastAssigneeScope = currentScope;
      v->info->usedAfterAssign = false;
      if (simpleAsgn)
        return;
    }
  }

  // it's usage
  v->info->used = true;
  if (assigned) {
    v->info->usedAfterAssign = true;
    v->assigned = e ? TO_PLUSEQ <= e->op() && e->op() <= TO_MODEQ : false;
  }

  if (v->state == VRS_PARTIALLY) {
    report(id, DiagnosticsId::DI_POSSIBLE_GARBAGE, id->id());
  }
  else if (v->state == VRS_UNDEFINED) {
    report(id, DiagnosticsId::DI_UNINITIALIZED_VAR);
  }
}